

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::dispose
          (ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *this)

{
  Dependency *firstElement;
  RemoveConst<capnp::_::RawBrandedSchema::Dependency> *pRVar1;
  Dependency *pDVar2;
  Dependency *endCopy;
  Dependency *posCopy;
  Dependency *ptrCopy;
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pDVar2 = this->endPtr;
  if (firstElement != (Dependency *)0x0) {
    this->ptr = (Dependency *)0x0;
    this->pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)0x0;
    this->endPtr = (Dependency *)0x0;
    ArrayDisposer::dispose<capnp::_::RawBrandedSchema::Dependency>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 4,
               (long)pDVar2 - (long)firstElement >> 4);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }